

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss_functions.cc
# Opt level: O3

float __thiscall
hingeloss::getLoss(hingeloss *this,shared_data *param_1,float prediction,float label)

{
  ostream *poVar1;
  float fVar2;
  
  if (((label != -1.0) || (NAN(label))) && ((label != 1.0 || (NAN(label))))) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"You are using label ",0x14);
    poVar1 = std::ostream::_M_insert<double>((double)label);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1," not -1 or 1 as loss function expects!",0x26);
    std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  fVar2 = 1.0 - label * prediction;
  if (fVar2 <= 0.0) {
    fVar2 = 0.0;
  }
  return fVar2;
}

Assistant:

float getLoss(shared_data*, float prediction, float label)
  {
    if (label != -1.f && label != 1.f)
      cout << "You are using label " << label << " not -1 or 1 as loss function expects!" << endl;
    float e = 1 - label * prediction;
    return (e > 0) ? e : 0;
  }